

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O3

void negotiate(Curl_easy *data)

{
  int iVar1;
  TELNET *pTVar2;
  TELNET *pTVar3;
  long lVar4;
  
  pTVar2 = (data->req).p.telnet;
  lVar4 = 0;
  do {
    if (lVar4 != 1) {
      if (pTVar2->us_preferred[lVar4] == 1) {
        pTVar3 = (data->req).p.telnet;
        iVar1 = pTVar3->us[lVar4];
        if (iVar1 == 3) {
          if (pTVar3->usq[lVar4] == 0) {
            pTVar3->usq[lVar4] = 1;
          }
        }
        else if (iVar1 == 2) {
          if (pTVar3->usq[lVar4] == 1) {
            pTVar3->usq[lVar4] = 0;
          }
        }
        else if (iVar1 == 0) {
          pTVar3->us[lVar4] = 2;
          send_negotiation(data,0xfb,(int)lVar4);
        }
      }
      if (pTVar2->him_preferred[lVar4] == 1) {
        pTVar3 = (data->req).p.telnet;
        iVar1 = pTVar3->him[lVar4];
        if (iVar1 == 3) {
          if (pTVar3->himq[lVar4] == 0) {
            pTVar3->himq[lVar4] = 1;
          }
        }
        else if (iVar1 == 2) {
          if (pTVar3->himq[lVar4] == 1) {
            pTVar3->himq[lVar4] = 0;
          }
        }
        else if (iVar1 == 0) {
          pTVar3->him[lVar4] = 2;
          send_negotiation(data,0xfd,(int)lVar4);
        }
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x28);
  return;
}

Assistant:

static void negotiate(struct Curl_easy *data)
{
  int i;
  struct TELNET *tn = data->req.p.telnet;

  for(i = 0; i < CURL_NTELOPTS; i++) {
    if(i == CURL_TELOPT_ECHO)
      continue;

    if(tn->us_preferred[i] == CURL_YES)
      set_local_option(data, i, CURL_YES);

    if(tn->him_preferred[i] == CURL_YES)
      set_remote_option(data, i, CURL_YES);
  }
}